

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

uint16_t bitset_container_maximum(bitset_container_t *container)

{
  unsigned_long_long input_num;
  int iVar1;
  long in_RDI;
  int r;
  uint64_t w;
  int32_t i;
  int local_14;
  
  local_14 = 0x3ff;
  while( true ) {
    if (local_14 < 1) {
      return 0;
    }
    input_num = *(unsigned_long_long *)(*(long *)(in_RDI + 8) + (long)local_14 * 8);
    if (input_num != 0) break;
    local_14 = local_14 + -1;
  }
  iVar1 = roaring_leading_zeroes(input_num);
  return ((short)(local_14 << 6) + 0x3f) - (short)iVar1;
}

Assistant:

uint16_t bitset_container_maximum(const bitset_container_t *container) {
  for (int32_t i = BITSET_CONTAINER_SIZE_IN_WORDS - 1; i > 0; --i ) {
    uint64_t w = container->words[i];
    if (w != 0) {
      int r = roaring_leading_zeroes(w);
      return i * 64 + 63  - r;
    }
  }
  return 0;
}